

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

bool __thiscall
kws::Parser::IsBetweenQuote(Parser *this,size_t pos,bool withComments,string *buffer)

{
  bool bVar1;
  bool bVar2;
  string sStack_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)buffer);
  bVar1 = IsBetweenSingleQuote(this,pos,withComments,&local_48);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&sStack_68,(string *)buffer);
    bVar2 = IsBetweenDoubleQuote(this,pos,withComments,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return bVar2;
}

Assistant:

bool Parser::IsBetweenQuote(size_t pos,bool withComments,std::string buffer) const
{
  return ( this->IsBetweenSingleQuote(pos,withComments,buffer) ||
    this->IsBetweenDoubleQuote(pos,withComments,buffer) );
}